

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRangeFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLRangeFactory::initializeKeywordMap(XMLRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  if ((this->super_RangeFactory).fKeywordsInitialized == false) {
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgXMLSpace,L"XML");
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgXMLDigit,L"XML");
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgXMLWord,L"XML");
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgXMLNameChar,L"XML");
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgXMLInitialNameChar,L"XML");
    (this->super_RangeFactory).fKeywordsInitialized = true;
  }
  return;
}

Assistant:

void XMLRangeFactory::initializeKeywordMap(RangeTokenMap *rangeTokMap) {

    if (fKeywordsInitialized)
        return;

    rangeTokMap->addKeywordMap(fgXMLSpace, fgXMLCategory);
    rangeTokMap->addKeywordMap(fgXMLDigit, fgXMLCategory);
    rangeTokMap->addKeywordMap(fgXMLWord, fgXMLCategory);
    rangeTokMap->addKeywordMap(fgXMLNameChar, fgXMLCategory);
    rangeTokMap->addKeywordMap(fgXMLInitialNameChar, fgXMLCategory);

    fKeywordsInitialized = true;
}